

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O3

void ConvertRGB24ToY_SSE2(uint8_t *rgb,uint8_t *y,int width)

{
  uint8_t *puVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  unkuint9 Var53;
  undefined1 auVar54 [11];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  unkuint9 Var57;
  undefined1 auVar58 [11];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  unkuint9 Var61;
  undefined1 auVar62 [11];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  bool bVar71;
  long lVar72;
  ulong uVar73;
  uint uVar74;
  ulong uVar75;
  bool bVar76;
  __m128i *palVar77;
  byte bVar78;
  undefined1 uVar79;
  unkint10 Var80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined2 uVar85;
  undefined2 uVar90;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  byte local_78;
  byte bStack_77;
  byte bStack_76;
  byte bStack_75;
  byte bStack_74;
  byte bStack_73;
  byte bStack_72;
  byte bStack_71;
  byte bStack_70;
  byte bStack_6f;
  byte bStack_6e;
  byte bStack_6d;
  byte bStack_6c;
  byte bStack_6b;
  byte bStack_6a;
  byte bStack_69;
  __m128i rgb_plane [6];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  
  auVar70 = _DAT_001b79d0;
  auVar69 = _DAT_001b79c0;
  if ((int)(width & 0xffffffe0U) < 1) {
    uVar74 = 0;
  }
  else {
    uVar73 = 0;
    do {
      local_78 = *rgb;
      bStack_77 = rgb[3];
      bStack_76 = rgb[6];
      bStack_75 = rgb[9];
      bStack_74 = rgb[0xc];
      bStack_73 = rgb[0xf];
      bStack_72 = rgb[0x12];
      bStack_71 = rgb[0x15];
      bStack_70 = rgb[0x18];
      bStack_6f = rgb[0x1b];
      bStack_6e = rgb[0x1e];
      bStack_6d = rgb[0x21];
      bStack_6c = rgb[0x24];
      bStack_6b = rgb[0x27];
      bStack_6a = rgb[0x2a];
      bStack_69 = rgb[0x2d];
      rgb_plane[0][0]._0_1_ = rgb[0x30];
      rgb_plane[0][0]._1_1_ = rgb[0x33];
      rgb_plane[0][0]._2_1_ = rgb[0x36];
      rgb_plane[0][0]._3_1_ = rgb[0x39];
      rgb_plane[0][0]._4_1_ = rgb[0x3c];
      rgb_plane[0][0]._5_1_ = rgb[0x3f];
      rgb_plane[0][0]._6_1_ = rgb[0x42];
      rgb_plane[0][0]._7_1_ = rgb[0x45];
      rgb_plane[0][1]._0_1_ = rgb[0x48];
      rgb_plane[0][1]._1_1_ = rgb[0x4b];
      rgb_plane[0][1]._2_1_ = rgb[0x4e];
      rgb_plane[0][1]._3_1_ = rgb[0x51];
      rgb_plane[0][1]._4_1_ = rgb[0x54];
      rgb_plane[0][1]._5_1_ = rgb[0x57];
      rgb_plane[0][1]._6_1_ = rgb[0x5a];
      rgb_plane[0][1]._7_1_ = rgb[0x5d];
      rgb_plane[1][0]._0_1_ = rgb[1];
      rgb_plane[1][0]._1_1_ = rgb[4];
      rgb_plane[1][0]._2_1_ = rgb[7];
      rgb_plane[1][0]._3_1_ = rgb[10];
      rgb_plane[1][0]._4_1_ = rgb[0xd];
      rgb_plane[1][0]._5_1_ = rgb[0x10];
      rgb_plane[1][0]._6_1_ = rgb[0x13];
      rgb_plane[1][0]._7_1_ = rgb[0x16];
      rgb_plane[1][1]._0_1_ = rgb[0x19];
      rgb_plane[1][1]._1_1_ = rgb[0x1c];
      rgb_plane[1][1]._2_1_ = rgb[0x1f];
      rgb_plane[1][1]._3_1_ = rgb[0x22];
      rgb_plane[1][1]._4_1_ = rgb[0x25];
      rgb_plane[1][1]._5_1_ = rgb[0x28];
      rgb_plane[1][1]._6_1_ = rgb[0x2b];
      rgb_plane[1][1]._7_1_ = rgb[0x2e];
      rgb_plane[2][0]._0_1_ = rgb[0x31];
      rgb_plane[2][0]._1_1_ = rgb[0x34];
      rgb_plane[2][0]._2_1_ = rgb[0x37];
      rgb_plane[2][0]._3_1_ = rgb[0x3a];
      rgb_plane[2][0]._4_1_ = rgb[0x3d];
      rgb_plane[2][0]._5_1_ = rgb[0x40];
      rgb_plane[2][0]._6_1_ = rgb[0x43];
      rgb_plane[2][0]._7_1_ = rgb[0x46];
      rgb_plane[2][1]._0_1_ = rgb[0x49];
      rgb_plane[2][1]._1_1_ = rgb[0x4c];
      rgb_plane[2][1]._2_1_ = rgb[0x4f];
      rgb_plane[2][1]._3_1_ = rgb[0x52];
      rgb_plane[2][1]._4_1_ = rgb[0x55];
      rgb_plane[2][1]._5_1_ = rgb[0x58];
      rgb_plane[2][1]._6_1_ = rgb[0x5b];
      rgb_plane[2][1]._7_1_ = rgb[0x5e];
      rgb_plane[3][0]._0_1_ = rgb[2];
      rgb_plane[3][0]._1_1_ = rgb[5];
      rgb_plane[3][0]._2_1_ = rgb[8];
      rgb_plane[3][0]._3_1_ = rgb[0xb];
      rgb_plane[3][0]._4_1_ = rgb[0xe];
      rgb_plane[3][0]._5_1_ = rgb[0x11];
      rgb_plane[3][0]._6_1_ = rgb[0x14];
      rgb_plane[3][0]._7_1_ = rgb[0x17];
      rgb_plane[3][1]._0_1_ = rgb[0x1a];
      rgb_plane[3][1]._1_1_ = rgb[0x1d];
      rgb_plane[3][1]._2_1_ = rgb[0x20];
      rgb_plane[3][1]._3_1_ = rgb[0x23];
      rgb_plane[3][1]._4_1_ = rgb[0x26];
      rgb_plane[3][1]._5_1_ = rgb[0x29];
      rgb_plane[3][1]._6_1_ = rgb[0x2c];
      rgb_plane[3][1]._7_1_ = rgb[0x2f];
      rgb_plane[4][0]._0_1_ = rgb[0x32];
      rgb_plane[4][0]._1_1_ = rgb[0x35];
      rgb_plane[4][0]._2_1_ = rgb[0x38];
      rgb_plane[4][0]._3_1_ = rgb[0x3b];
      rgb_plane[4][0]._4_1_ = rgb[0x3e];
      rgb_plane[4][0]._5_1_ = rgb[0x41];
      rgb_plane[4][0]._6_1_ = rgb[0x44];
      rgb_plane[4][0]._7_1_ = rgb[0x47];
      rgb_plane[4][1]._0_1_ = rgb[0x4a];
      rgb_plane[4][1]._1_1_ = rgb[0x4d];
      rgb_plane[4][1]._2_1_ = rgb[0x50];
      rgb_plane[4][1]._3_1_ = rgb[0x53];
      rgb_plane[4][1]._4_1_ = rgb[0x56];
      rgb_plane[4][1]._5_1_ = rgb[0x59];
      rgb_plane[4][1]._6_1_ = rgb[0x5c];
      rgb_plane[4][1]._7_1_ = rgb[0x5f];
      uVar75 = uVar73 & 0xffffffff;
      uVar73 = (ulong)(int)uVar73;
      lVar72 = 0;
      palVar77 = (__m128i *)&local_78;
      bVar71 = true;
      do {
        bVar76 = bVar71;
        alVar2 = *palVar77;
        auVar21[0xd] = 0;
        auVar21._0_13_ = alVar2._0_13_;
        auVar21[0xe] = alVar2[0]._7_1_;
        auVar24[0xc] = alVar2[0]._6_1_;
        auVar24._0_12_ = alVar2._0_12_;
        auVar24._13_2_ = auVar21._13_2_;
        auVar27[0xb] = 0;
        auVar27._0_11_ = alVar2._0_11_;
        auVar27._12_3_ = auVar24._12_3_;
        auVar30[10] = alVar2[0]._5_1_;
        auVar30._0_10_ = alVar2._0_10_;
        auVar30._11_4_ = auVar27._11_4_;
        auVar35[9] = 0;
        auVar35._0_9_ = alVar2._0_9_;
        auVar35._10_5_ = auVar30._10_5_;
        auVar40[8] = alVar2[0]._4_1_;
        auVar40._0_8_ = alVar2[0];
        auVar40._9_6_ = auVar35._9_6_;
        auVar52._7_8_ = 0;
        auVar52._0_7_ = auVar40._8_7_;
        Var53 = CONCAT81(SUB158(auVar52 << 0x40,7),alVar2[0]._3_1_);
        auVar63._9_6_ = 0;
        auVar63._0_9_ = Var53;
        auVar54._1_10_ = SUB1510(auVar63 << 0x30,5);
        auVar54[0] = alVar2[0]._2_1_;
        auVar64._11_4_ = 0;
        auVar64._0_11_ = auVar54;
        auVar49[2] = alVar2[0]._1_1_;
        auVar49._0_2_ = (short)alVar2[0];
        auVar49._3_12_ = SUB1512(auVar64 << 0x20,3);
        auVar55._13_2_ = 0;
        auVar55._0_13_ = auVar49._2_13_;
        alVar3 = rgb_plane[lVar72 + 1];
        alVar4 = rgb_plane[lVar72 + 3];
        uVar79 = alVar3[0]._7_1_;
        auVar22[0xd] = 0;
        auVar22._0_13_ = alVar3._0_13_;
        auVar22[0xe] = uVar79;
        auVar25[0xc] = alVar3[0]._6_1_;
        auVar25._0_12_ = alVar3._0_12_;
        auVar25._13_2_ = auVar22._13_2_;
        auVar28[0xb] = 0;
        auVar28._0_11_ = alVar3._0_11_;
        auVar28._12_3_ = auVar25._12_3_;
        auVar31[10] = alVar3[0]._5_1_;
        auVar31._0_10_ = alVar3._0_10_;
        auVar31._11_4_ = auVar28._11_4_;
        auVar36[9] = 0;
        auVar36._0_9_ = alVar3._0_9_;
        auVar36._10_5_ = auVar31._10_5_;
        auVar41[8] = alVar3[0]._4_1_;
        auVar41._0_8_ = alVar3[0];
        auVar41._9_6_ = auVar36._9_6_;
        auVar56._7_8_ = 0;
        auVar56._0_7_ = auVar41._8_7_;
        Var57 = CONCAT81(SUB158(auVar56 << 0x40,7),alVar3[0]._3_1_);
        auVar65._9_6_ = 0;
        auVar65._0_9_ = Var57;
        auVar58._1_10_ = SUB1510(auVar65 << 0x30,5);
        auVar58[0] = alVar3[0]._2_1_;
        auVar66._11_4_ = 0;
        auVar66._0_11_ = auVar58;
        uVar85 = (undefined2)alVar3[0];
        auVar50[2] = alVar3[0]._1_1_;
        auVar50._0_2_ = uVar85;
        auVar50._3_12_ = SUB1512(auVar66 << 0x20,3);
        auVar59._13_2_ = 0;
        auVar59._0_13_ = auVar50._2_13_;
        auVar23[0xd] = 0;
        auVar23._0_13_ = alVar4._0_13_;
        auVar23[0xe] = alVar4[0]._7_1_;
        auVar26[0xc] = alVar4[0]._6_1_;
        auVar26._0_12_ = alVar4._0_12_;
        auVar26._13_2_ = auVar23._13_2_;
        auVar29[0xb] = 0;
        auVar29._0_11_ = alVar4._0_11_;
        auVar29._12_3_ = auVar26._12_3_;
        auVar32[10] = alVar4[0]._5_1_;
        auVar32._0_10_ = alVar4._0_10_;
        auVar32._11_4_ = auVar29._11_4_;
        auVar37[9] = 0;
        auVar37._0_9_ = alVar4._0_9_;
        auVar37._10_5_ = auVar32._10_5_;
        auVar42[8] = alVar4[0]._4_1_;
        auVar42._0_8_ = alVar4[0];
        auVar42._9_6_ = auVar37._9_6_;
        auVar60._7_8_ = 0;
        auVar60._0_7_ = auVar42._8_7_;
        Var61 = CONCAT81(SUB158(auVar60 << 0x40,7),alVar4[0]._3_1_);
        auVar67._9_6_ = 0;
        auVar67._0_9_ = Var61;
        auVar62._1_10_ = SUB1510(auVar67 << 0x30,5);
        auVar62[0] = alVar4[0]._2_1_;
        auVar68._11_4_ = 0;
        auVar68._0_11_ = auVar62;
        auVar51[2] = alVar4[0]._1_1_;
        auVar51._0_2_ = (short)alVar4[0];
        auVar51._3_12_ = SUB1512(auVar68 << 0x20,3);
        uVar90 = (undefined2)Var57;
        auVar97._0_12_ = SUB1512(auVar55 << 0x10,0);
        auVar97._12_2_ = (short)Var53;
        auVar97._14_2_ = uVar90;
        auVar96._12_4_ = auVar97._12_4_;
        auVar96._0_10_ = SUB1510(auVar55 << 0x10,0);
        auVar96._10_2_ = auVar58._0_2_;
        auVar95._10_6_ = auVar96._10_6_;
        auVar95._8_2_ = auVar54._0_2_;
        auVar95._6_2_ = auVar50._2_2_;
        auVar95._4_2_ = auVar49._2_2_;
        auVar95._0_4_ = CONCAT22(uVar85,(short)alVar2[0]) & 0xff00ff;
        auVar91._2_2_ = auVar41._8_2_;
        auVar91._0_2_ = auVar40._8_2_;
        auVar91._4_2_ = auVar30._10_2_;
        auVar91._6_2_ = auVar31._10_2_;
        auVar91._8_2_ = auVar24._12_2_;
        auVar91._10_2_ = auVar25._12_2_;
        auVar91[0xc] = alVar2[0]._7_1_;
        auVar91[0xd] = 0;
        auVar91[0xe] = uVar79;
        auVar91[0xf] = 0;
        auVar81._0_12_ = SUB1512(auVar59 << 0x10,0);
        auVar81._12_2_ = uVar90;
        auVar81._14_2_ = (short)Var61;
        auVar98._12_4_ = auVar81._12_4_;
        auVar98._0_10_ = SUB1510(auVar59 << 0x10,0);
        auVar98._10_2_ = auVar62._0_2_;
        auVar84._10_6_ = auVar98._10_6_;
        auVar84._8_2_ = auVar58._0_2_;
        auVar84._6_2_ = auVar51._2_2_;
        auVar84._4_2_ = auVar50._2_2_;
        auVar84._0_4_ = CONCAT22((short)alVar4[0],uVar85) & 0xff00ff;
        auVar86._2_2_ = auVar42._8_2_;
        auVar86._0_2_ = auVar41._8_2_;
        auVar86._4_2_ = auVar31._10_2_;
        auVar86._6_2_ = auVar32._10_2_;
        auVar86._8_2_ = auVar25._12_2_;
        auVar86._10_2_ = auVar26._12_2_;
        auVar86[0xc] = uVar79;
        auVar86[0xd] = 0;
        auVar86[0xe] = alVar4[0]._7_1_;
        auVar86[0xf] = 0;
        auVar98 = pmaddwd(auVar95,auVar69);
        auVar92 = pmaddwd(auVar91,auVar69);
        auVar82 = pmaddwd(auVar84,auVar70);
        auVar87 = pmaddwd(auVar86,auVar70);
        auVar83._0_4_ = auVar82._0_4_ + auVar98._0_4_ + 0x108000U >> 0x10;
        auVar83._4_4_ = auVar82._4_4_ + auVar98._4_4_ + 0x108000U >> 0x10;
        auVar83._8_4_ = auVar82._8_4_ + auVar98._8_4_ + 0x108000U >> 0x10;
        auVar83._12_4_ = auVar82._12_4_ + auVar98._12_4_ + 0x108000U >> 0x10;
        auVar88._0_4_ = auVar87._0_4_ + auVar92._0_4_ + 0x108000U >> 0x10;
        auVar88._4_4_ = auVar87._4_4_ + auVar92._4_4_ + 0x108000U >> 0x10;
        auVar88._8_4_ = auVar87._8_4_ + auVar92._8_4_ + 0x108000U >> 0x10;
        auVar88._12_4_ = auVar87._12_4_ + auVar92._12_4_ + 0x108000U >> 0x10;
        auVar84 = packssdw(auVar83,auVar88);
        auVar89[1] = 0;
        auVar89[0] = (byte)alVar2[1];
        Var80 = (unkuint10)alVar2[1]._4_1_ << 0x40;
        auVar33[10] = alVar2[1]._5_1_;
        auVar33._0_10_ = Var80;
        auVar33[0xb] = 0;
        auVar93[1] = 0;
        auVar93[0] = (byte)alVar3[1];
        bVar78 = alVar3[1]._4_1_;
        uVar79 = alVar3[1]._5_1_;
        auVar34[10] = uVar79;
        auVar34._0_10_ = (unkuint10)bVar78 << 0x40;
        auVar34[0xb] = 0;
        auVar33[0xc] = alVar2[1]._3_1_;
        auVar33[0xd] = 0;
        auVar33[0xe] = alVar3[1]._3_1_;
        auVar38[10] = alVar3[1]._2_1_;
        auVar38._0_10_ = Var80;
        auVar38[0xb] = 0;
        auVar38._12_3_ = auVar33._12_3_;
        auVar43._10_5_ = auVar38._10_5_;
        auVar43._0_10_ = (unkuint10)alVar2[1]._2_1_ << 0x40;
        auVar45._8_7_ = auVar43._8_7_;
        auVar45._0_8_ = (ulong)alVar3[1]._1_1_ << 0x30;
        auVar47._6_9_ = auVar45._6_9_;
        auVar47._0_6_ = (uint6)alVar2[1]._1_1_ << 0x20;
        auVar89[2] = (byte)alVar3[1];
        auVar89[3] = 0;
        auVar89._4_11_ = auVar47._4_11_;
        auVar89[0xf] = 0;
        auVar92[1] = 0;
        auVar92[0] = alVar2[1]._4_1_;
        auVar82[1] = 0;
        auVar82[0] = bVar78;
        auVar92[2] = bVar78;
        auVar92[3] = 0;
        auVar92[4] = alVar2[1]._5_1_;
        auVar92[5] = 0;
        auVar92[6] = uVar79;
        auVar92[7] = 0;
        auVar92[8] = alVar2[1]._6_1_;
        auVar92[9] = 0;
        auVar92[10] = alVar3[1]._6_1_;
        auVar92[0xb] = 0;
        auVar92[0xc] = alVar2[1]._7_1_;
        auVar92[0xd] = 0;
        auVar92[0xe] = alVar3[1]._7_1_;
        auVar92[0xf] = 0;
        auVar34[0xc] = alVar3[1]._3_1_;
        auVar34[0xd] = 0;
        auVar34[0xe] = alVar4[1]._3_1_;
        auVar39[10] = alVar4[1]._2_1_;
        auVar39._0_10_ = (unkuint10)bVar78 << 0x40;
        auVar39[0xb] = 0;
        auVar39._12_3_ = auVar34._12_3_;
        auVar44._10_5_ = auVar39._10_5_;
        auVar44._0_10_ = (unkuint10)alVar3[1]._2_1_ << 0x40;
        auVar46._8_7_ = auVar44._8_7_;
        auVar46._0_8_ = (ulong)alVar4[1]._1_1_ << 0x30;
        auVar48._6_9_ = auVar46._6_9_;
        auVar48._0_6_ = (uint6)alVar3[1]._1_1_ << 0x20;
        auVar93[2] = (char)alVar4[1];
        auVar93[3] = 0;
        auVar93._4_11_ = auVar48._4_11_;
        auVar93[0xf] = 0;
        auVar82[2] = alVar4[1]._4_1_;
        auVar82[3] = 0;
        auVar82[4] = uVar79;
        auVar82[5] = 0;
        auVar82[6] = alVar4[1]._5_1_;
        auVar82[7] = 0;
        auVar82[8] = alVar3[1]._6_1_;
        auVar82[9] = 0;
        auVar82[10] = alVar4[1]._6_1_;
        auVar82[0xb] = 0;
        auVar82[0xc] = alVar3[1]._7_1_;
        auVar82[0xd] = 0;
        auVar82[0xe] = alVar4[1]._7_1_;
        auVar82[0xf] = 0;
        auVar87 = pmaddwd(auVar89,auVar69);
        auVar92 = pmaddwd(auVar92,auVar69);
        auVar98 = pmaddwd(auVar93,auVar70);
        auVar82 = pmaddwd(auVar82,auVar70);
        auVar94._0_4_ = auVar98._0_4_ + auVar87._0_4_ + 0x108000 >> 0x10;
        auVar94._4_4_ = auVar98._4_4_ + auVar87._4_4_ + 0x108000 >> 0x10;
        auVar94._8_4_ = auVar98._8_4_ + auVar87._8_4_ + 0x108000 >> 0x10;
        auVar94._12_4_ = auVar98._12_4_ + auVar87._12_4_ + 0x108000 >> 0x10;
        auVar87._0_4_ = auVar82._0_4_ + auVar92._0_4_ + 0x108000 >> 0x10;
        auVar87._4_4_ = auVar82._4_4_ + auVar92._4_4_ + 0x108000 >> 0x10;
        auVar87._8_4_ = auVar82._8_4_ + auVar92._8_4_ + 0x108000 >> 0x10;
        auVar87._12_4_ = auVar82._12_4_ + auVar92._12_4_ + 0x108000 >> 0x10;
        auVar82 = packssdw(auVar94,auVar87);
        sVar5 = auVar84._0_2_;
        sVar6 = auVar84._2_2_;
        sVar7 = auVar84._4_2_;
        sVar8 = auVar84._6_2_;
        sVar9 = auVar84._8_2_;
        sVar10 = auVar84._10_2_;
        sVar11 = auVar84._12_2_;
        sVar12 = auVar84._14_2_;
        sVar13 = auVar82._0_2_;
        sVar14 = auVar82._2_2_;
        sVar15 = auVar82._4_2_;
        sVar16 = auVar82._6_2_;
        sVar17 = auVar82._8_2_;
        sVar18 = auVar82._10_2_;
        sVar19 = auVar82._12_2_;
        sVar20 = auVar82._14_2_;
        puVar1 = y + uVar73;
        *puVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar84[0] - (0xff < sVar5);
        puVar1[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar84[2] - (0xff < sVar6);
        puVar1[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar84[4] - (0xff < sVar7);
        puVar1[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar84[6] - (0xff < sVar8);
        puVar1[4] = (0 < sVar9) * (sVar9 < 0x100) * auVar84[8] - (0xff < sVar9);
        puVar1[5] = (0 < sVar10) * (sVar10 < 0x100) * auVar84[10] - (0xff < sVar10);
        puVar1[6] = (0 < sVar11) * (sVar11 < 0x100) * auVar84[0xc] - (0xff < sVar11);
        puVar1[7] = (0 < sVar12) * (sVar12 < 0x100) * auVar84[0xe] - (0xff < sVar12);
        puVar1[8] = (0 < sVar13) * (sVar13 < 0x100) * auVar82[0] - (0xff < sVar13);
        puVar1[9] = (0 < sVar14) * (sVar14 < 0x100) * auVar82[2] - (0xff < sVar14);
        puVar1[10] = (0 < sVar15) * (sVar15 < 0x100) * auVar82[4] - (0xff < sVar15);
        puVar1[0xb] = (0 < sVar16) * (sVar16 < 0x100) * auVar82[6] - (0xff < sVar16);
        puVar1[0xc] = (0 < sVar17) * (sVar17 < 0x100) * auVar82[8] - (0xff < sVar17);
        puVar1[0xd] = (0 < sVar18) * (sVar18 < 0x100) * auVar82[10] - (0xff < sVar18);
        puVar1[0xe] = (0 < sVar19) * (sVar19 < 0x100) * auVar82[0xc] - (0xff < sVar19);
        puVar1[0xf] = (0 < sVar20) * (sVar20 < 0x100) * auVar82[0xe] - (0xff < sVar20);
        uVar73 = uVar73 + 0x10;
        uVar74 = (int)uVar75 + 0x10;
        uVar75 = (ulong)uVar74;
        lVar72 = 1;
        palVar77 = rgb_plane;
        bVar71 = false;
      } while (bVar76);
      rgb = rgb + 0x60;
    } while ((int)uVar74 < (int)(width & 0xffffffe0U));
  }
  if ((int)uVar74 < width) {
    lVar72 = (long)(int)uVar74;
    do {
      y[lVar72] = (uint8_t)((uint)rgb[2] * 0x1914 + (uint)rgb[1] * 0x8123 + (uint)*rgb * 0x41c7 +
                            0x108000 >> 0x10);
      lVar72 = lVar72 + 1;
      rgb = rgb + 3;
    } while (width != lVar72);
  }
  return;
}

Assistant:

static void ConvertRGB24ToY_SSE2(const uint8_t* WEBP_RESTRICT rgb,
                                 uint8_t* WEBP_RESTRICT y, int width) {
  const int max_width = width & ~31;
  int i;
  for (i = 0; i < max_width; rgb += 3 * 16 * 2) {
    __m128i rgb_plane[6];
    int j;

    RGB24PackedToPlanar_SSE2(rgb, rgb_plane);

    for (j = 0; j < 2; ++j, i += 16) {
      const __m128i zero = _mm_setzero_si128();
      __m128i r, g, b, Y0, Y1;

      // Convert to 16-bit Y.
      r = _mm_unpacklo_epi8(rgb_plane[0 + j], zero);
      g = _mm_unpacklo_epi8(rgb_plane[2 + j], zero);
      b = _mm_unpacklo_epi8(rgb_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y0);

      // Convert to 16-bit Y.
      r = _mm_unpackhi_epi8(rgb_plane[0 + j], zero);
      g = _mm_unpackhi_epi8(rgb_plane[2 + j], zero);
      b = _mm_unpackhi_epi8(rgb_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y1);

      // Cast to 8-bit and store.
      STORE_16(_mm_packus_epi16(Y0, Y1), y + i);
    }
  }
  for (; i < width; ++i, rgb += 3) {   // left-over
    y[i] = VP8RGBToY(rgb[0], rgb[1], rgb[2], YUV_HALF);
  }
}